

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  string delimiter;
  allocator local_92;
  allocator local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  bVar1 = ConsumeMessageDelimiter(this,&local_90);
  if (bVar1) {
    __lhs = &(this->tokenizer_).current_.text;
    do {
      std::__cxx11::string::string((string *)&local_70,">",&local_91);
      _Var2 = std::operator==(__lhs,&local_70);
      if (_Var2) {
        std::__cxx11::string::~string((string *)&local_70);
LAB_00607c69:
        bVar1 = Consume(this,&local_90);
        goto LAB_00607c78;
      }
      std::__cxx11::string::string((string *)&local_50,"}",&local_92);
      _Var2 = std::operator==(__lhs,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (_Var2) goto LAB_00607c69;
      bVar1 = SkipField(this);
    } while (bVar1);
  }
  bVar1 = false;
LAB_00607c78:
  std::__cxx11::string::~string((string *)&local_90);
  return bVar1;
}

Assistant:

bool SkipFieldMessage() {
    string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") &&  !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));
    return true;
  }